

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

CURLcode Curl_ntlm_core_mk_lm_hash(Curl_easy *data,char *password,uchar *lmbuffer)

{
  size_t sVar1;
  anon_union_8_2_85ee1207 local_d0;
  undefined1 local_c8 [8];
  DES_key_schedule ks;
  size_t len;
  uchar uStack_33;
  uchar pw [14];
  CURLcode result;
  uchar *lmbuffer_local;
  char *password_local;
  Curl_easy *data_local;
  
  unique0x1000014d = (DES_cblock *)lmbuffer;
  sVar1 = strlen(password);
  if (sVar1 < 0xe) {
    local_d0 = (anon_union_8_2_85ee1207)strlen(password);
  }
  else {
    local_d0 = (anon_union_8_2_85ee1207)0xe;
  }
  ks.ks[0xf] = local_d0;
  Curl_strntoupper((char *)((long)&len + 6),password,(size_t)local_d0);
  memset((void *)((long)&len + (long)ks.ks[0xf] + 6),0,0xe - (long)ks.ks[0xf]);
  pw[6] = '\0';
  pw[7] = '\0';
  pw[8] = '\0';
  pw[9] = '\0';
  setup_des_key((uchar *)((long)&len + 6),(DES_key_schedule *)local_c8);
  DES_ecb_encrypt((const_DES_cblock *)"KGS!@#$%",stack0xffffffffffffffd8,
                  (DES_key_schedule *)local_c8,1);
  setup_des_key(&uStack_33,(DES_key_schedule *)local_c8);
  DES_ecb_encrypt((const_DES_cblock *)"KGS!@#$%",stack0xffffffffffffffd8 + 1,
                  (DES_key_schedule *)local_c8,1);
  memset(stack0xffffffffffffffd8 + 2,0,5);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ntlm_core_mk_lm_hash(struct Curl_easy *data,
                                   const char *password,
                                   unsigned char *lmbuffer /* 21 bytes */)
{
  CURLcode result;
  unsigned char pw[14];
  static const unsigned char magic[] = {
    0x4B, 0x47, 0x53, 0x21, 0x40, 0x23, 0x24, 0x25 /* i.e. KGS!@#$% */
  };
  size_t len = CURLMIN(strlen(password), 14);

  Curl_strntoupper((char *)pw, password, len);
  memset(&pw[len], 0, 14 - len);

  /*
   * The LanManager hashed password needs to be created using the
   * password in the network encoding not the host encoding.
   */
  result = Curl_convert_to_network(data, (char *)pw, 14);
  if(result)
    return result;

  {
    /* Create LanManager hashed password. */

#ifdef USE_OPENSSL
    DES_key_schedule ks;

    setup_des_key(pw, DESKEY(ks));
    DES_ecb_encrypt((DES_cblock *)magic, (DES_cblock *)lmbuffer,
                    DESKEY(ks), DES_ENCRYPT);

    setup_des_key(pw + 7, DESKEY(ks));
    DES_ecb_encrypt((DES_cblock *)magic, (DES_cblock *)(lmbuffer + 8),
                    DESKEY(ks), DES_ENCRYPT);
#elif defined(USE_GNUTLS_NETTLE)
    struct des_ctx des;
    setup_des_key(pw, &des);
    des_encrypt(&des, 8, lmbuffer, magic);
    setup_des_key(pw + 7, &des);
    des_encrypt(&des, 8, lmbuffer + 8, magic);
#elif defined(USE_GNUTLS)
    gcry_cipher_hd_t des;

    gcry_cipher_open(&des, GCRY_CIPHER_DES, GCRY_CIPHER_MODE_ECB, 0);
    setup_des_key(pw, &des);
    gcry_cipher_encrypt(des, lmbuffer, 8, magic, 8);
    gcry_cipher_close(des);

    gcry_cipher_open(&des, GCRY_CIPHER_DES, GCRY_CIPHER_MODE_ECB, 0);
    setup_des_key(pw + 7, &des);
    gcry_cipher_encrypt(des, lmbuffer + 8, 8, magic, 8);
    gcry_cipher_close(des);
#elif defined(USE_NSS) || defined(USE_MBEDTLS) || defined(USE_SECTRANSP) \
  || defined(USE_OS400CRYPTO) || defined(USE_WIN32_CRYPTO)
    encrypt_des(magic, lmbuffer, pw);
    encrypt_des(magic, lmbuffer + 8, pw + 7);
#endif

    memset(lmbuffer + 16, 0, 21 - 16);
  }

  return CURLE_OK;
}